

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_session.cc
# Opt level: O0

bool bssl::ssl_encrypt_ticket(SSL_HANDSHAKE *hs,CBB *out,SSL_SESSION *session)

{
  int iVar1;
  pointer psVar2;
  unique_ptr<unsigned_char,_bssl::internal::Deleter> local_40;
  UniquePtr<uint8_t> free_session_buf;
  size_t session_len;
  uint8_t *session_buf;
  SSL_SESSION *session_local;
  CBB *out_local;
  SSL_HANDSHAKE *hs_local;
  
  session_len = 0;
  session_buf = (uint8_t *)session;
  session_local = (SSL_SESSION *)out;
  out_local = (CBB *)hs;
  iVar1 = SSL_SESSION_to_bytes_for_ticket
                    (session,(uint8_t **)&session_len,(size_t *)&free_session_buf);
  if (iVar1 == 0) {
    hs_local._7_1_ = 0;
  }
  else {
    std::unique_ptr<unsigned_char,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<unsigned_char,bssl::internal::Deleter> *)&local_40,(pointer)session_len);
    psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->
                       ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                        &out_local->child[2].u.base);
    if (psVar2->ticket_aead_method == (SSL_TICKET_AEAD_METHOD *)0x0) {
      iVar1 = ssl_encrypt_ticket_with_cipher_ctx
                        ((SSL_HANDSHAKE *)out_local,(CBB *)session_local,(uint8_t *)session_len,
                         (size_t)free_session_buf._M_t.
                                 super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
    }
    else {
      iVar1 = ssl_encrypt_ticket_with_method
                        ((SSL_HANDSHAKE *)out_local,(CBB *)session_local,(uint8_t *)session_len,
                         (size_t)free_session_buf._M_t.
                                 super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
    }
    hs_local._7_1_ = iVar1 != 0;
    std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&local_40);
  }
  return (bool)(hs_local._7_1_ & 1);
}

Assistant:

bool ssl_encrypt_ticket(SSL_HANDSHAKE *hs, CBB *out,
                        const SSL_SESSION *session) {
  // Serialize the SSL_SESSION to be encoded into the ticket.
  uint8_t *session_buf = nullptr;
  size_t session_len;
  if (!SSL_SESSION_to_bytes_for_ticket(session, &session_buf, &session_len)) {
    return false;
  }
  bssl::UniquePtr<uint8_t> free_session_buf(session_buf);

  if (hs->ssl->session_ctx->ticket_aead_method) {
    return ssl_encrypt_ticket_with_method(hs, out, session_buf, session_len);
  } else {
    return ssl_encrypt_ticket_with_cipher_ctx(hs, out, session_buf,
                                              session_len);
  }
}